

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall CVmObjGramProd::delete_alt_undo(CVmObjGramProd *this,vm_obj_id_t self,int idx)

{
  int iVar1;
  vmgram_undo_rec *this_00;
  vm_gram_ext *this_01;
  vm_obj_id_t in_EDX;
  CVmObjGramProd *in_RDI;
  vmgram_undo_rec *rec;
  vmgram_undo_rec *this_02;
  vm_obj_id_t obj;
  
  this_00 = (vmgram_undo_rec *)operator_new(0x10);
  obj = in_EDX;
  this_01 = get_ext(in_RDI);
  vmgram_undo_rec::vmgram_undo_rec(this_00,1,obj,this_01->alts_[(int)in_EDX]);
  this_02 = this_00;
  iVar1 = CVmUndo::add_new_record_ptr_key((CVmUndo *)this_01,obj,this_00);
  if ((iVar1 == 0) && (this_00 != (vmgram_undo_rec *)0x0)) {
    vmgram_undo_rec::~vmgram_undo_rec(this_00);
    operator_delete(this_00,0x10);
  }
  delete_alt((CVmObjGramProd *)this_02,(size_t)in_RDI);
  return;
}

Assistant:

void CVmObjGramProd::delete_alt_undo(VMG_ vm_obj_id_t self, int idx)

{
    /* create an undo record for deleting this item */
    vmgram_undo_rec *rec = new vmgram_undo_rec(
        VMGRAM_UNDO_DELETED, idx, get_ext()->alts_[idx]);

    /* save the record */
    if (!G_undo->add_new_record_ptr_key(vmg_ self, rec))
        delete rec;
    
    /* remove the alternative from the array */
    delete_alt(idx);
}